

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O3

void __thiscall Market::erase(Market *this,Order *order)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long *__s2;
  int iVar3;
  const_iterator __position;
  const_iterator __position_00;
  string id;
  long *local_50;
  _Base_ptr local_48;
  long local_40 [2];
  
  pcVar2 = (order->m_clientId)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (order->m_clientId)._M_string_length);
  __s2 = local_50;
  if (order->m_side == sell) {
    __position_00._M_node = (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    p_Var1 = &(this->m_askOrders)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position_00._M_node != p_Var1) {
      do {
        if ((__position_00._M_node[1]._M_left == local_48) &&
           ((local_48 == (_Base_ptr)0x0 ||
            (iVar3 = bcmp(__position_00._M_node[1]._M_parent,__s2,(size_t)local_48), iVar3 == 0))))
        {
          std::
          _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
          ::_M_erase_aux(&(this->m_askOrders)._M_t,__position_00);
          break;
        }
        __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
      } while ((_Rb_tree_header *)__position_00._M_node != p_Var1);
    }
  }
  else if (order->m_side == buy) {
    __position._M_node = (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      do {
        if ((__position._M_node[1]._M_left == local_48) &&
           ((local_48 == (_Base_ptr)0x0 ||
            (iVar3 = bcmp(__position._M_node[1]._M_parent,__s2,(size_t)local_48), iVar3 == 0)))) {
          std::
          _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
          ::_M_erase_aux(&(this->m_bidOrders)._M_t,__position);
          break;
        }
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      } while ((_Rb_tree_header *)__position._M_node != p_Var1);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void Market::erase(const Order &order) {
  std::string id = order.getClientID();
  if (order.getSide() == Order::buy) {
    BidOrders::iterator i;
    for (i = m_bidOrders.begin(); i != m_bidOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        m_bidOrders.erase(i);
        return;
      }
    }
  } else if (order.getSide() == Order::sell) {
    AskOrders::iterator i;
    for (i = m_askOrders.begin(); i != m_askOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        m_askOrders.erase(i);
        return;
      }
    }
  }
}